

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

char * TextToUpper(char *text)

{
  int iVar1;
  int local_14;
  int i;
  char *text_local;
  
  local_14 = 0;
  while( true ) {
    if (0x3ff < local_14) {
      return TextToUpper::buffer;
    }
    if (text[local_14] == '\0') break;
    iVar1 = toupper((int)text[local_14]);
    TextToUpper::buffer[local_14] = (char)iVar1;
    local_14 = local_14 + 1;
  }
  TextToUpper::buffer[local_14] = '\0';
  return TextToUpper::buffer;
}

Assistant:

const char *TextToUpper(const char *text)
{
    static char buffer[MAX_TEXT_BUFFER_LENGTH] = { 0 };

    for (int i = 0; i < MAX_TEXT_BUFFER_LENGTH; i++)
    {
        if (text[i] != '\0')
        {
            buffer[i] = (char)toupper(text[i]);
            //if ((text[i] >= 'a') && (text[i] <= 'z')) buffer[i] = text[i] - 32;

            // TODO: Support Utf8 diacritics!
            //if ((text[i] >= 'à') && (text[i] <= 'ý')) buffer[i] = text[i] - 32;
        }
        else { buffer[i] = '\0'; break; }
    }

    return buffer;
}